

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall jessilib::thread_pool::join(thread_pool *this)

{
  bool bVar1;
  thread *worker_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_> *__range1_1;
  undefined1 local_48 [8];
  unique_lock<std::mutex> guard_1;
  thread *worker;
  iterator __end1;
  iterator __begin1;
  vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_> *__range1;
  lock_guard<std::mutex> guard;
  thread_pool *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range1,&this->m_threads_mutex);
  __end1 = std::
           vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>::
           begin(&this->m_threads);
  worker = (thread *)
           std::
           vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>::
           end(&this->m_threads);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<jessilib::thread_pool::thread_*,_std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>_>
                      (&__end1,(__normal_iterator<jessilib::thread_pool::thread_*,_std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>_>
                                *)&worker);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    guard_1._8_8_ =
         __gnu_cxx::
         __normal_iterator<jessilib::thread_pool::thread_*,_std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>_>
         ::operator*(&__end1);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_48,&((reference)guard_1._8_8_)->m_notifier_mutex);
    *(undefined1 *)(guard_1._8_8_ + 1) = 1;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
    std::condition_variable::notify_one();
    __gnu_cxx::
    __normal_iterator<jessilib::thread_pool::thread_*,_std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>::
             begin(&this->m_threads);
  worker_1 = (thread *)
             std::
             vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>::
             end(&this->m_threads);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<jessilib::thread_pool::thread_*,_std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>_>
                      (&__end1_1,
                       (__normal_iterator<jessilib::thread_pool::thread_*,_std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>_>
                        *)&worker_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<jessilib::thread_pool::thread_*,_std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>_>
    ::operator*(&__end1_1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<jessilib::thread_pool::thread_*,_std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>::clear
            (&this->m_threads);
  while( true ) {
    bVar1 = std::
            queue<jessilib::thread_pool::thread_*,_std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>_>
            ::empty(&this->m_inactive_threads);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    queue<jessilib::thread_pool::thread_*,_std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>_>
    ::pop(&this->m_inactive_threads);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  return;
}

Assistant:

void thread_pool::join() {
	std::lock_guard<std::mutex> guard(m_threads_mutex);

	// Shutdown threads
	for (thread& worker : m_threads) {
		// Mark thread for shutdown
		{
			std::unique_lock<std::mutex> guard(worker.m_notifier_mutex);
			worker.m_shutdown = true;
		}

		// Notify thread to shutdown
		worker.m_notifier.notify_one();
	}

	// Join threads
	for (thread& worker : m_threads) {
		worker.m_thread.join();
	}

	// Cleanup threads
	m_threads.clear();
	while (!m_inactive_threads.empty()) {
		m_inactive_threads.pop();
	}
}